

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOptimizationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Performance::anon_unknown_1::ShaderOptimizationCase::iterate
          (ShaderOptimizationCase *this)

{
  TestContext *this_00;
  bool bVar1;
  deUint32 dVar2;
  TestLog *this_01;
  SharedPtr<const_glu::ShaderProgram> *this_02;
  ShaderProgram *this_03;
  char *pcVar3;
  Result *pRVar4;
  MessageBuilder *pMVar5;
  State SVar6;
  int extraout_EDX;
  int extraout_EDX_00;
  int precision;
  float fVar7;
  float local_5b8;
  float local_5b4;
  string local_558;
  int local_534;
  MessageBuilder local_530;
  MessageBuilder local_3b0;
  MessageBuilder local_230;
  int local_b0;
  float local_ac;
  int handOptimizationGain;
  float ratio;
  char *relevantResultName;
  float local_98;
  float optimizedRelevantResult;
  float unoptimizedRelevantResult;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  ScopedLogSection local_30;
  ScopedLogSection section;
  bool optimized_1;
  bool optimized;
  TestLog *log;
  ShaderOptimizationCase *this_local;
  
  this_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  if ((this->m_state == STATE_INIT_UNOPTIMIZED) || (this->m_state == STATE_INIT_OPTIMIZED)) {
    section.m_log._7_1_ = this->m_state == STATE_INIT_OPTIMIZED;
    this_02 = program(this,(bool)section.m_log._7_1_);
    this_03 = de::SharedPtr<const_glu::ShaderProgram>::operator->(this_02);
    dVar2 = glu::ShaderProgram::getProgram(this_03);
    programData(this,(bool)(section.m_log._7_1_ & 1));
    deqp::gls::ShaderPerformanceMeasurer::init(&this->m_measurer,(EVP_PKEY_CTX *)(ulong)dVar2);
    SVar6 = STATE_MEASURE_UNOPTIMIZED;
    if ((section.m_log._7_1_ & 1) != 0) {
      SVar6 = STATE_MEASURE_OPTIMIZED;
    }
    this->m_state = SVar6;
    this_local._4_4_ = CONTINUE;
  }
  else if ((this->m_state == STATE_MEASURE_UNOPTIMIZED) ||
          (this->m_state == STATE_MEASURE_OPTIMIZED)) {
    deqp::gls::ShaderPerformanceMeasurer::iterate(&this->m_measurer);
    bVar1 = deqp::gls::ShaderPerformanceMeasurer::isFinished(&this->m_measurer);
    if (bVar1) {
      section.m_log._6_1_ = this->m_state == STATE_MEASURE_OPTIMIZED;
      pcVar3 = "UnoptimizedResult";
      if ((bool)section.m_log._6_1_) {
        pcVar3 = "OptimizedResult";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar3,&local_51);
      pcVar3 = "Measurement result for unoptimized program";
      if ((section.m_log._6_1_ & 1) != 0) {
        pcVar3 = "Measurement results for hand-optimized program";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar3,&local_89);
      tcu::ScopedLogSection::ScopedLogSection(&local_30,this_01,&local_50,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      deqp::gls::ShaderPerformanceMeasurer::logMeasurementInfo(&this->m_measurer,this_01);
      _optimizedRelevantResult = deqp::gls::ShaderPerformanceMeasurer::getResult(&this->m_measurer);
      pRVar4 = result(this,(bool)(section.m_log._6_1_ & 1));
      *pRVar4 = _optimizedRelevantResult;
      deqp::gls::ShaderPerformanceMeasurer::deinit(&this->m_measurer);
      SVar6 = STATE_INIT_OPTIMIZED;
      if ((section.m_log._6_1_ & 1) != 0) {
        SVar6 = STATE_FINISHED;
      }
      this->m_state = SVar6;
      tcu::ScopedLogSection::~ScopedLogSection(&local_30);
    }
    this_local._4_4_ = CONTINUE;
  }
  else {
    if (this->m_caseShaderType == CASESHADERTYPE_VERTEX) {
      local_5b4 = (this->m_unoptimizedResult).megaVertPerSec;
    }
    else {
      local_5b4 = (this->m_unoptimizedResult).megaFragPerSec;
    }
    local_98 = local_5b4;
    if (this->m_caseShaderType == CASESHADERTYPE_VERTEX) {
      local_5b8 = (this->m_optimizedResult).megaVertPerSec;
    }
    else {
      local_5b8 = (this->m_optimizedResult).megaFragPerSec;
    }
    relevantResultName._4_4_ = local_5b8;
    _handOptimizationGain = "Vertex and fragment";
    if (this->m_caseShaderType == CASESHADERTYPE_VERTEX) {
      _handOptimizationGain = "Unexpected vertex";
    }
    _handOptimizationGain = _handOptimizationGain + 0xb;
    local_ac = local_5b4 / local_5b8;
    fVar7 = deFloatRound(100.0 / local_ac);
    local_b0 = (int)fVar7 + -100;
    tcu::TestLog::operator<<(&local_230,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_230,(char (*) [25])"Unoptimized / optimized ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char **)&handOptimizationGain);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [21])" performance ratio: ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_ac);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_230);
    if (local_b0 < 0) {
      tcu::TestLog::operator<<(&local_530,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_530,
                          (char (*) [49])"Note: hand-optimization degraded performance by ");
      local_534 = -local_b0;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_534);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8ec59);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_530);
      precision = extraout_EDX_00;
    }
    else {
      tcu::TestLog::operator<<(&local_3b0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_3b0,(char (*) [7])0x2bb307b);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_b0);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,(char (*) [60])
                                 "% performance gain was achieved with hand-optimized version");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3b0);
      precision = extraout_EDX;
    }
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    de::floatToString_abi_cxx11_(&local_558,(de *)0x2,local_ac,precision);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,pcVar3);
    std::__cxx11::string::~string((string *)&local_558);
    this_local._4_4_ = STOP;
  }
  return this_local._4_4_;
}

Assistant:

ShaderOptimizationCase::IterateResult ShaderOptimizationCase::iterate (void)
{
	TestLog& log = m_testCtx.getLog();

	if (m_state == STATE_INIT_UNOPTIMIZED || m_state == STATE_INIT_OPTIMIZED)
	{
		const bool optimized = m_state == STATE_INIT_OPTIMIZED;
		m_measurer.init(program(optimized)->getProgram(), programData(optimized).attributes, 1);
		m_state = optimized ? STATE_MEASURE_OPTIMIZED : STATE_MEASURE_UNOPTIMIZED;

		return CONTINUE;
	}
	else if (m_state == STATE_MEASURE_UNOPTIMIZED || m_state == STATE_MEASURE_OPTIMIZED)
	{
		m_measurer.iterate();

		if (m_measurer.isFinished())
		{
			const bool						optimized	= m_state == STATE_MEASURE_OPTIMIZED;
			const tcu::ScopedLogSection		section		(log, optimized ? "OptimizedResult"									: "UnoptimizedResult",
															  optimized ? "Measurement results for hand-optimized program"	: "Measurement result for unoptimized program");
			m_measurer.logMeasurementInfo(log);
			result(optimized) = m_measurer.getResult();
			m_measurer.deinit();
			m_state = optimized ? STATE_FINISHED : STATE_INIT_OPTIMIZED;
		}

		return CONTINUE;
	}
	else
	{
		DE_ASSERT(m_state == STATE_FINISHED);

		const float			unoptimizedRelevantResult	= m_caseShaderType == CASESHADERTYPE_VERTEX ? m_unoptimizedResult.megaVertPerSec	: m_unoptimizedResult.megaFragPerSec;
		const float			optimizedRelevantResult		= m_caseShaderType == CASESHADERTYPE_VERTEX ? m_optimizedResult.megaVertPerSec		: m_optimizedResult.megaFragPerSec;
		const char* const	relevantResultName			= m_caseShaderType == CASESHADERTYPE_VERTEX ? "vertex"								: "fragment";
		const float			ratio						= unoptimizedRelevantResult / optimizedRelevantResult;
		const int			handOptimizationGain		= (int)deFloatRound(100.0f/ratio) - 100;

		log << TestLog::Message << "Unoptimized / optimized " << relevantResultName << " performance ratio: " << ratio << TestLog::EndMessage;

		if (handOptimizationGain >= 0)
			log << TestLog::Message << "Note: " << handOptimizationGain << "% performance gain was achieved with hand-optimized version" << TestLog::EndMessage;
		else
			log << TestLog::Message << "Note: hand-optimization degraded performance by " << -handOptimizationGain << "%" << TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(ratio, 2).c_str());

		return STOP;
	}
}